

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_motion.c
# Opt level: O1

int64_t av1_segmented_frame_error
                  (int use_hbd,int bd,uint8_t *ref,int ref_stride,uint8_t *dst,int dst_stride,
                  int p_width,int p_height,uint8_t *segment_map,int segment_map_stride)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  uint8_t *puVar10;
  long lVar11;
  long lVar12;
  uint8_t *puVar13;
  int iVar14;
  long lVar15;
  int64_t iVar16;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  long lVar20;
  long lVar21;
  uint8_t *puVar22;
  uint8_t *puVar23;
  long lVar24;
  long lVar25;
  uint8_t *puVar26;
  uint8_t *puVar27;
  uint uVar28;
  
  if (use_hbd == 0) {
    if (0 < p_height) {
      lVar21 = (long)dst_stride;
      lVar25 = (long)ref_stride;
      uVar7 = 0;
      iVar16 = 0;
      puVar23 = ref;
      puVar27 = dst;
      do {
        if (0 < p_width) {
          lVar11 = (uint)p_height - uVar7;
          uVar3 = (uint)lVar11;
          if (p_height < (int)uVar3) {
            uVar3 = p_height;
          }
          uVar19 = 0x20;
          if ((int)uVar3 < 0x20) {
            uVar19 = (ulong)uVar3;
          }
          uVar8 = 0;
          puVar22 = puVar23;
          puVar26 = puVar27;
          uVar28 = p_width;
          do {
            uVar1 = uVar28;
            if (p_width < (int)uVar28) {
              uVar1 = p_width;
            }
            uVar2 = (ulong)uVar1;
            if (0x1f < (int)uVar1) {
              uVar2 = 0x20;
            }
            if (segment_map[(int)(uVar8 >> 5) + (int)(uVar7 >> 5) * segment_map_stride] != '\0') {
              lVar15 = (long)p_width - uVar8;
              iVar14 = (int)lVar15;
              if (p_width < iVar14) {
                iVar14 = p_width;
              }
              if ((iVar14 < 0x20) || ((int)uVar3 < 0x20)) {
                if (lVar11 < 1) {
                  uVar2 = 0;
                }
                else {
                  uVar6 = 0;
                  iVar14 = 0;
                  puVar10 = puVar26;
                  puVar13 = puVar22;
                  do {
                    if (0 < lVar15) {
                      uVar17 = 0;
                      do {
                        uVar18 = (uint)puVar10[uVar17] - (uint)puVar13[uVar17];
                        uVar1 = -uVar18;
                        if (0 < (int)uVar18) {
                          uVar1 = uVar18;
                        }
                        iVar14 = iVar14 + (uVar1 & 0xff);
                        uVar17 = uVar17 + 1;
                      } while (uVar2 != uVar17);
                    }
                    uVar6 = uVar6 + 1;
                    puVar13 = puVar13 + lVar25;
                    puVar10 = puVar10 + lVar21;
                  } while (uVar6 != uVar19);
                  uVar2 = (ulong)iVar14;
                }
              }
              else {
                uVar1 = (*aom_sad32x32)(ref + uVar8 + uVar7 * lVar25,ref_stride,
                                        dst + uVar8 + uVar7 * lVar21,dst_stride);
                uVar2 = (ulong)uVar1;
              }
              iVar16 = iVar16 + uVar2;
            }
            uVar8 = uVar8 + 0x20;
            uVar28 = uVar28 - 0x20;
            puVar22 = puVar22 + 0x20;
            puVar26 = puVar26 + 0x20;
          } while ((long)uVar8 < (long)p_width);
        }
        uVar7 = uVar7 + 0x20;
        puVar23 = puVar23 + lVar25 * 0x20;
        puVar27 = puVar27 + lVar21 * 0x20;
      } while (uVar7 < (uint)p_height);
      return iVar16;
    }
  }
  else if (0 < p_height) {
    lVar11 = (long)dst_stride;
    lVar15 = (long)ref_stride;
    uVar7 = 0;
    iVar16 = 0;
    lVar21 = (long)ref * 2;
    lVar25 = (long)dst * 2;
    do {
      if (0 < p_width) {
        lVar4 = (uint)p_height - uVar7;
        uVar3 = (uint)lVar4;
        if (p_height < (int)uVar3) {
          uVar3 = p_height;
        }
        uVar19 = 0x20;
        if ((int)uVar3 < 0x20) {
          uVar19 = (ulong)uVar3;
        }
        uVar8 = 0;
        lVar20 = lVar21;
        lVar24 = lVar25;
        uVar28 = p_width;
        do {
          uVar1 = uVar28;
          if (p_width < (int)uVar28) {
            uVar1 = p_width;
          }
          uVar2 = (ulong)uVar1;
          if (0x1f < (int)uVar1) {
            uVar2 = 0x20;
          }
          if (segment_map[(int)(uVar8 >> 5) + (int)(uVar7 >> 5) * segment_map_stride] != '\0') {
            lVar5 = (long)p_width - uVar8;
            iVar14 = (int)lVar5;
            if (p_width < iVar14) {
              iVar14 = p_width;
            }
            if ((iVar14 < 0x20) || ((int)uVar3 < 0x20)) {
              if (lVar4 < 1) {
                uVar2 = 0;
              }
              else {
                uVar6 = 0;
                iVar14 = 0;
                lVar9 = lVar24;
                lVar12 = lVar20;
                do {
                  if (0 < lVar5) {
                    uVar17 = 0;
                    do {
                      uVar18 = (uint)*(ushort *)(lVar9 + uVar17 * 2) -
                               (uint)*(ushort *)(lVar12 + uVar17 * 2);
                      uVar1 = -uVar18;
                      if (0 < (int)uVar18) {
                        uVar1 = uVar18;
                      }
                      iVar14 = iVar14 + (uVar1 & 0xffff);
                      uVar17 = uVar17 + 1;
                    } while (uVar2 != uVar17);
                  }
                  uVar6 = uVar6 + 1;
                  lVar12 = lVar12 + lVar15 * 2;
                  lVar9 = lVar9 + lVar11 * 2;
                } while (uVar6 != uVar19);
                uVar2 = (ulong)iVar14;
              }
            }
            else {
              uVar1 = (*aom_highbd_sad32x32)
                                ((uint8_t *)((long)ref * 2 + uVar7 * lVar15 * 2 + uVar8 * 2 >> 1),
                                 ref_stride,
                                 (uint8_t *)((long)dst * 2 + uVar7 * lVar11 * 2 + uVar8 * 2 >> 1),
                                 dst_stride);
              uVar2 = (ulong)uVar1;
            }
            iVar16 = iVar16 + uVar2;
          }
          uVar8 = uVar8 + 0x20;
          uVar28 = uVar28 - 0x20;
          lVar20 = lVar20 + 0x40;
          lVar24 = lVar24 + 0x40;
        } while ((long)uVar8 < (long)p_width);
      }
      uVar7 = uVar7 + 0x20;
      lVar21 = lVar21 + lVar15 * 0x40;
      lVar25 = lVar25 + lVar11 * 0x40;
    } while (uVar7 < (uint)p_height);
    return iVar16;
  }
  return 0;
}

Assistant:

int64_t av1_segmented_frame_error(int use_hbd, int bd, const uint8_t *ref,
                                  int ref_stride, uint8_t *dst, int dst_stride,
                                  int p_width, int p_height,
                                  uint8_t *segment_map,
                                  int segment_map_stride) {
#if CONFIG_AV1_HIGHBITDEPTH
  if (use_hbd) {
    return highbd_segmented_frame_error(
        CONVERT_TO_SHORTPTR(ref), ref_stride, CONVERT_TO_SHORTPTR(dst),
        dst_stride, p_width, p_height, bd, segment_map, segment_map_stride);
  }
#endif
  (void)use_hbd;
  (void)bd;
  return segmented_frame_error(ref, ref_stride, dst, dst_stride, p_width,
                               p_height, segment_map, segment_map_stride);
}